

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_unnest_expression.cpp
# Opt level: O0

BindResult * __thiscall
duckdb::SelectBinder::BindUnnest
          (SelectBinder *this,FunctionExpression *function,idx_t depth,bool root_expression)

{
  bool bVar1;
  LogicalTypeId LVar2;
  uint uVar3;
  uint32_t uVar4;
  undefined8 uVar5;
  size_type sVar6;
  pointer pPVar7;
  BaseExpression *this_00;
  pointer pEVar8;
  ulong uVar9;
  pointer pBVar10;
  string *psVar11;
  pointer ppVar12;
  long in_RCX;
  BaseExpression *in_RDX;
  long *in_RSI;
  BindResult *in_RDI;
  byte in_R8B;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_BoundUnnestNode>_&&>::value,_pair<iterator,_bool>_>
  _Var13;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *entry_1;
  const_iterator __end6;
  const_iterator __begin6;
  child_list_t<LogicalType> *__range6;
  idx_t child_index;
  child_list_t<LogicalType> *child_types;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  iterator __end3;
  iterator __begin3;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range3;
  bool has_structs;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  new_expressions;
  idx_t i_1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  struct_expressions;
  BoundUnnestNode unnest_node;
  idx_t unnest_column_index;
  idx_t unnest_table_index;
  iterator entry;
  idx_t current_level;
  string alias_1;
  templated_unique_single_t result_1;
  idx_t current_depth;
  LogicalType return_type;
  LogicalType type;
  type unnest_expr;
  idx_t struct_unnests;
  idx_t list_unnests;
  LogicalType *child_type;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *bound_expr;
  BindResult result;
  bool recursive;
  Value value;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *const_child;
  string alias;
  idx_t i;
  bool supported_argument;
  bool has_parameter;
  idx_t max_depth;
  ErrorData error;
  ErrorData *in_stack_fffffffffffff4f8;
  Binder *in_stack_fffffffffffff500;
  ErrorData *in_stack_fffffffffffff508;
  BindResult *in_stack_fffffffffffff510;
  ErrorData *in_stack_fffffffffffff518;
  ErrorData *in_stack_fffffffffffff520;
  LogicalType *in_stack_fffffffffffff538;
  ParsedExpression *in_stack_fffffffffffff540;
  undefined7 in_stack_fffffffffffff548;
  LogicalTypeId in_stack_fffffffffffff54f;
  string *in_stack_fffffffffffff560;
  string *in_stack_fffffffffffff568;
  BinderException *in_stack_fffffffffffff570;
  undefined7 in_stack_fffffffffffff578;
  undefined1 in_stack_fffffffffffff57f;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false>
  in_stack_fffffffffffff580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff588;
  ErrorData *in_stack_fffffffffffff598;
  string *in_stack_fffffffffffff5a0;
  Expression *in_stack_fffffffffffff5a8;
  Binder *in_stack_fffffffffffff5b0;
  undefined1 in_stack_fffffffffffff5df;
  Expression *in_stack_fffffffffffff5e0;
  ClientContext *in_stack_fffffffffffff5e8;
  allocator *paVar14;
  string *in_stack_fffffffffffff718;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_fffffffffffff720;
  undefined7 in_stack_fffffffffffff728;
  undefined1 in_stack_fffffffffffff72f;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
  *in_stack_fffffffffffff730;
  ClientContext *in_stack_fffffffffffff738;
  ErrorData *in_stack_fffffffffffff768;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *in_stack_fffffffffffff770;
  undefined7 in_stack_fffffffffffff778;
  undefined1 in_stack_fffffffffffff77f;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_800 [3];
  string local_7e8 [32];
  undefined1 local_7c8 [16];
  reference local_7b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  *local_7b0;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
  local_7a8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *local_7a0;
  undefined1 local_798 [16];
  ulong local_788;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *local_780;
  reference local_778;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_770;
  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_768;
  undefined1 *local_760;
  byte local_751;
  ulong local_738;
  undefined1 local_730 [24];
  ColumnBinding local_718 [2];
  undefined1 local_6f8 [16];
  undefined1 local_6e8;
  idx_t local_6b0;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false> local_690;
  idx_t local_688;
  idx_t local_680;
  _Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false> local_678;
  long local_670;
  string local_668 [40];
  ulong local_640;
  LogicalType local_638;
  allocator local_619;
  string local_618 [48];
  LogicalType local_5e8;
  ulong local_5c8;
  ulong local_5c0;
  string local_5b8 [39];
  allocator local_591;
  string local_590 [54];
  undefined1 local_55a;
  allocator local_559;
  string local_558 [32];
  LogicalType *local_538;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_530;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_528;
  LogicalType *in_stack_fffffffffffffb08;
  allocator local_391;
  string local_390 [55];
  undefined1 local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [38];
  undefined1 local_30a;
  allocator local_309;
  string local_308 [39];
  undefined1 local_2e1;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_2a0;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> local_298 [16];
  string local_218 [38];
  undefined1 local_1f2;
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [48];
  ulong local_198;
  byte local_18a;
  byte local_189;
  unsigned_long local_188;
  undefined1 local_17a;
  allocator local_179;
  string local_178 [32];
  string local_158 [48];
  uint local_128;
  allocator local_121;
  string local_120 [48];
  ErrorData local_f0;
  allocator local_59;
  string local_58 [55];
  byte local_21;
  BaseExpression *local_18;
  
  local_21 = in_R8B & 1;
  if (in_RCX != 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_58,"UNNEST() for correlated expressions is not supported yet",&local_59);
    BinderException::BinderException<>
              (in_stack_fffffffffffff570,(ParsedExpression *)in_stack_fffffffffffff568,
               in_stack_fffffffffffff560);
    BindResult::BindResult(in_stack_fffffffffffff510,(Exception *)in_stack_fffffffffffff508);
    BinderException::~BinderException((BinderException *)0xda9f3b);
    ::std::__cxx11::string::~string(local_58);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
    return in_RDI;
  }
  local_18 = in_RDX;
  ErrorData::ErrorData((ErrorData *)in_stack_fffffffffffff500);
  bVar1 = ::std::
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
          ::empty((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   *)in_stack_fffffffffffff510);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_120,"UNNEST() requires a single argument",&local_121);
    BinderException::BinderException<>
              (in_stack_fffffffffffff570,(ParsedExpression *)in_stack_fffffffffffff568,
               in_stack_fffffffffffff560);
    BindResult::BindResult(in_stack_fffffffffffff510,(Exception *)in_stack_fffffffffffff508);
    BinderException::~BinderException((BinderException *)0xdaa076);
    ::std::__cxx11::string::~string(local_120);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_121);
    local_128 = 1;
  }
  else {
    if ((*(byte *)(in_RSI + 0xd) & 1) == 0) {
      if ((((byte)local_18[3].alias._M_dataplus & 1) == 0) &&
         (bVar1 = ::std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                              *)0xdaa230), !bVar1)) {
        unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
        operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                    *)in_stack_fffffffffffff500);
        bVar1 = ::std::vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>::empty
                          ((vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_> *)
                           in_stack_fffffffffffff510);
        if (bVar1) {
          local_188 = 1;
          sVar6 = ::std::
                  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                  ::size((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                          *)&local_18[2].query_location);
          if (sVar6 != 1) {
            local_189 = 0;
            local_18a = 0;
            for (local_198 = 1; uVar9 = local_198,
                sVar6 = ::std::
                        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                        ::size((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                *)&local_18[2].query_location), uVar9 < sVar6;
                local_198 = local_198 + 1) {
              if ((local_189 & 1) != 0) {
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1c8,"UNNEST() only supports a single additional argument",
                           &local_1c9);
                BinderException::BinderException<>
                          (in_stack_fffffffffffff570,(ParsedExpression *)in_stack_fffffffffffff568,
                           in_stack_fffffffffffff560);
                BindResult::BindResult
                          (in_stack_fffffffffffff510,(Exception *)in_stack_fffffffffffff508);
                BinderException::~BinderException((BinderException *)0xdaa46b);
                ::std::__cxx11::string::~string(local_1c8);
                ::std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
                local_128 = 1;
                goto LAB_00dac308;
              }
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)in_stack_fffffffffffff500,(size_type)in_stack_fffffffffffff4f8);
              pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)in_stack_fffffffffffff500);
              uVar3 = (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[6])();
              in_stack_fffffffffffff77f = (undefined1)uVar3;
              if ((uVar3 & 1) != 0) {
                local_1f2 = 1;
                uVar5 = __cxa_allocate_exception(0x10);
                paVar14 = &local_1f1;
                ::std::allocator<char>::allocator();
                ::std::__cxx11::string::string
                          (local_1f0,"Parameter not allowed in unnest parameter",paVar14);
                ParameterNotAllowedException::ParameterNotAllowedException
                          ((ParameterNotAllowedException *)in_stack_fffffffffffff500,
                           (string *)in_stack_fffffffffffff4f8);
                local_1f2 = 0;
                __cxa_throw(uVar5,&ParameterNotAllowedException::typeinfo,
                            ParameterNotAllowedException::~ParameterNotAllowedException);
              }
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)in_stack_fffffffffffff500,(size_type)in_stack_fffffffffffff4f8);
              pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                     *)in_stack_fffffffffffff500);
              uVar3 = (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[5])();
              if ((uVar3 & 1) == 0) break;
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)in_stack_fffffffffffff500,(size_type)in_stack_fffffffffffff4f8);
              this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                                       *)in_stack_fffffffffffff500)->super_BaseExpression;
              in_stack_fffffffffffff738 =
                   (ClientContext *)BaseExpression::GetAlias_abi_cxx11_(this_00);
              StringUtil::Lower((string *)
                                CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548));
              in_stack_fffffffffffff730 =
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                   ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                 *)in_stack_fffffffffffff500,(size_type)in_stack_fffffffffffff4f8);
              ExpressionBinder::BindChild
                        ((ExpressionBinder *)in_stack_fffffffffffff5b0,
                         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                          *)in_stack_fffffffffffff5a8,(idx_t)in_stack_fffffffffffff5a0,
                         in_stack_fffffffffffff598);
              in_stack_fffffffffffff72f = ErrorData::HasError(&local_f0);
              if ((bool)in_stack_fffffffffffff72f) {
                in_stack_fffffffffffff720 = local_298;
                ErrorData::ErrorData
                          ((ErrorData *)in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
                BindResult::BindResult(in_stack_fffffffffffff510,in_stack_fffffffffffff508);
                ErrorData::~ErrorData((ErrorData *)in_stack_fffffffffffff500);
                local_128 = 1;
              }
              else {
                in_stack_fffffffffffff718 =
                     (string *)
                     vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                     ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                   *)in_stack_fffffffffffff500,(size_type)in_stack_fffffffffffff4f8)
                ;
                unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)in_stack_fffffffffffff500);
                local_2a0 = BoundExpression::GetExpression(in_stack_fffffffffffff540);
                unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)in_stack_fffffffffffff500);
                ExpressionExecutor::EvaluateScalar
                          (in_stack_fffffffffffff5e8,in_stack_fffffffffffff5e0,
                           (bool)in_stack_fffffffffffff5df);
                bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)in_stack_fffffffffffff500,
                                          &in_stack_fffffffffffff4f8->initialized);
                if (bVar1) {
                  local_2e1 = Value::GetValue<bool>((Value *)0xdaa917);
                  if ((bool)local_2e1) {
                    local_188 = NumericLimits<unsigned_long>::Maximum();
                  }
LAB_00daac23:
                  local_189 = 1;
                  local_18a = 1;
                  local_128 = 0;
                }
                else {
                  bVar1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)in_stack_fffffffffffff500,
                                            &in_stack_fffffffffffff4f8->initialized);
                  if (bVar1) {
                    uVar4 = Value::GetValue<unsigned_int>((Value *)0xdaa9b3);
                    local_188 = (unsigned_long)uVar4;
                    if (local_188 == 0) {
                      local_30a = 1;
                      uVar5 = __cxa_allocate_exception(0x10);
                      ::std::allocator<char>::allocator();
                      ::std::__cxx11::string::string
                                (local_308,"UNNEST cannot have a max depth of 0",&local_309);
                      BinderException::BinderException
                                ((BinderException *)in_stack_fffffffffffff500,
                                 (string *)in_stack_fffffffffffff4f8);
                      local_30a = 0;
                      __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException
                                 );
                    }
                    goto LAB_00daac23;
                  }
                  uVar9 = ::std::__cxx11::string::empty();
                  if ((uVar9 & 1) == 0) {
                    local_359 = 1;
                    uVar5 = __cxa_allocate_exception(0x10);
                    ::std::allocator<char>::allocator();
                    ::std::__cxx11::string::string
                              (local_330,"Unsupported parameter \"%s\" for unnest",&local_331);
                    ::std::__cxx11::string::string(local_358,local_218);
                    BinderException::BinderException<std::__cxx11::string>
                              (in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff560);
                    local_359 = 0;
                    __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
                  }
                  local_128 = 2;
                }
                Value::~Value((Value *)in_stack_fffffffffffff500);
              }
              ::std::__cxx11::string::~string(local_218);
              if (local_128 != 0) {
                if (local_128 != 2) goto LAB_00dac308;
                break;
              }
            }
            if ((local_18a & 1) == 0) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_390,
                         "UNNEST - unsupported extra argument, unnest only supports recursive := [true/false] or max_depth := #"
                         ,&local_391);
              BinderException::BinderException<>
                        (in_stack_fffffffffffff570,(ParsedExpression *)in_stack_fffffffffffff568,
                         in_stack_fffffffffffff560);
              BindResult::BindResult
                        (in_stack_fffffffffffff510,(Exception *)in_stack_fffffffffffff508);
              BinderException::~BinderException((BinderException *)0xdaad4b);
              ::std::__cxx11::string::~string(local_390);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_391);
              local_128 = 1;
              goto LAB_00dac308;
            }
          }
          in_RSI[0x10] = in_RSI[0x10] + 1;
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        *)in_stack_fffffffffffff500,(size_type)in_stack_fffffffffffff4f8);
          ExpressionBinder::BindChild
                    ((ExpressionBinder *)in_stack_fffffffffffff5b0,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)in_stack_fffffffffffff5a8,(idx_t)in_stack_fffffffffffff5a0,
                     in_stack_fffffffffffff598);
          bVar1 = ErrorData::HasError(&local_f0);
          if (bVar1) {
            vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
            ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                          *)in_stack_fffffffffffff500,(size_type)in_stack_fffffffffffff4f8);
            ErrorData::ErrorData(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
            ExpressionBinder::BindCorrelatedColumns
                      ((ExpressionBinder *)
                       CONCAT17(in_stack_fffffffffffff77f,in_stack_fffffffffffff778),
                       in_stack_fffffffffffff770,in_stack_fffffffffffff768);
            ErrorData::~ErrorData((ErrorData *)in_stack_fffffffffffff500);
            bVar1 = BindResult::HasError((BindResult *)0xdaaee5);
            if (bVar1) {
              ErrorData::ErrorData(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
              BindResult::BindResult(in_stack_fffffffffffff510,in_stack_fffffffffffff508);
              ErrorData::~ErrorData((ErrorData *)in_stack_fffffffffffff500);
            }
            else {
              vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                            *)in_stack_fffffffffffff500,(size_type)in_stack_fffffffffffff4f8);
              unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                           *)in_stack_fffffffffffff500);
              local_528 = BoundExpression::GetExpression(in_stack_fffffffffffff540);
              unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffff500);
              ExpressionBinder::ExtractCorrelatedExpressions
                        (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8);
            }
            local_128 = (uint)bVar1;
            BindResult::~BindResult((BindResult *)in_stack_fffffffffffff500);
            if (local_128 != 0) goto LAB_00dac308;
          }
          vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
          ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                        *)in_stack_fffffffffffff500,(size_type)in_stack_fffffffffffff4f8);
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          ::operator*((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                       *)in_stack_fffffffffffff500);
          local_530 = BoundExpression::GetExpression(in_stack_fffffffffffff540);
          pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                   operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)in_stack_fffffffffffff500);
          local_538 = &pEVar8->return_type;
          in_RSI[0x10] = in_RSI[0x10] + -1;
          if (in_RSI[0x10] != 0) {
            local_55a = 1;
            uVar5 = __cxa_allocate_exception(0x10);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_558,
                       "Nested UNNEST calls are not supported - use UNNEST(x, recursive := true) to unnest multiple levels"
                       ,&local_559);
            BinderException::BinderException<>
                      (in_stack_fffffffffffff570,(ParsedExpression *)in_stack_fffffffffffff568,
                       in_stack_fffffffffffff560);
            local_55a = 0;
            __cxa_throw(uVar5,&BinderException::typeinfo,BinderException::~BinderException);
          }
          LVar2 = LogicalType::id(local_538);
          if (LVar2 != SQLNULL) {
            if (LVar2 == UNKNOWN) {
              uVar5 = __cxa_allocate_exception(0x10);
              ParameterNotResolvedException::ParameterNotResolvedException
                        ((ParameterNotResolvedException *)in_stack_fffffffffffff540);
              __cxa_throw(uVar5,&ParameterNotResolvedException::typeinfo,
                          ParameterNotResolvedException::~ParameterNotResolvedException);
            }
            if (1 < (byte)(LVar2 + 0x9c)) {
              ::std::allocator<char>::allocator();
              ::std::__cxx11::string::string
                        (local_590,"UNNEST() can only be applied to lists, structs and NULL, not %s"
                         ,&local_591);
              LogicalType::ToString_abi_cxx11_(in_stack_fffffffffffffb08);
              BinderException::BinderException<std::__cxx11::string>
                        ((BinderException *)in_stack_fffffffffffff5b0,
                         (ParsedExpression *)in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff598);
              BindResult::BindResult
                        (in_stack_fffffffffffff510,(Exception *)in_stack_fffffffffffff508);
              BinderException::~BinderException((BinderException *)0xdab398);
              ::std::__cxx11::string::~string(local_5b8);
              ::std::__cxx11::string::~string(local_590);
              ::std::allocator<char>::~allocator((allocator<char> *)&local_591);
              local_128 = 1;
              goto LAB_00dac308;
            }
          }
          local_5c8 = 0;
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::unique_ptr
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffff500,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)in_stack_fffffffffffff4f8);
          LVar2 = LogicalType::id(local_538);
          if (LVar2 == SQLNULL) {
            local_5c0 = 1;
          }
          else {
            LogicalType::LogicalType
                      ((LogicalType *)in_stack_fffffffffffff500,
                       (LogicalType *)in_stack_fffffffffffff4f8);
            local_5c0 = 0;
            do {
              LVar2 = LogicalType::id(&local_5e8);
              if (LVar2 != LIST) break;
              ListType::GetChildType((LogicalType *)in_stack_fffffffffffff500);
              LogicalType::operator=
                        ((LogicalType *)in_stack_fffffffffffff508,
                         (LogicalType *)in_stack_fffffffffffff500);
              local_5c0 = local_5c0 + 1;
            } while (local_5c0 < local_188);
            LVar2 = LogicalType::id(&local_5e8);
            if (LVar2 == STRUCT) {
              local_5c8 = local_188 - local_5c0;
            }
            LogicalType::~LogicalType((LogicalType *)0xdab5d9);
          }
          if ((local_5c8 == 0) || ((local_21 & 1) != 0)) {
            LogicalType::LogicalType
                      ((LogicalType *)in_stack_fffffffffffff500,
                       (LogicalType *)in_stack_fffffffffffff4f8);
            for (local_640 = 0; local_640 < local_5c0; local_640 = local_640 + 1) {
              LVar2 = LogicalType::id(&local_638);
              if (LVar2 == LIST) {
                ListType::GetChildType((LogicalType *)in_stack_fffffffffffff500);
                LogicalType::operator=
                          ((LogicalType *)in_stack_fffffffffffff508,
                           (LogicalType *)in_stack_fffffffffffff500);
              }
              make_uniq<duckdb::BoundUnnestExpression,duckdb::LogicalType&>
                        (in_stack_fffffffffffff538);
              unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                            *)in_stack_fffffffffffff500);
              unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator=((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffff500,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffff4f8);
              BaseExpression::GetAlias_abi_cxx11_(local_18);
              uVar9 = ::std::__cxx11::string::empty();
              if ((uVar9 & 1) == 0) {
                psVar11 = BaseExpression::GetAlias_abi_cxx11_(local_18);
                ::std::__cxx11::string::string(local_668,(string *)psVar11);
              }
              else {
                pBVar10 = unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                          ::operator->((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                                        *)in_stack_fffffffffffff500);
                (*(pBVar10->super_Expression).super_BaseExpression._vptr_BaseExpression[8])
                          (local_668);
              }
              local_670 = ~local_640 + in_RSI[0x10] + local_5c0;
              local_678._M_cur =
                   (__node_type *)
                   ::std::
                   unordered_map<unsigned_long,_duckdb::BoundUnnestNode,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>_>
                   ::find((unordered_map<unsigned_long,_duckdb::BoundUnnestNode,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>_>
                           *)in_stack_fffffffffffff4f8,(key_type *)0xdab8e7);
              local_690._M_cur =
                   (__node_type *)
                   ::std::
                   unordered_map<unsigned_long,_duckdb::BoundUnnestNode,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>_>
                   ::end((unordered_map<unsigned_long,_duckdb::BoundUnnestNode,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>_>
                          *)in_stack_fffffffffffff4f8);
              bVar1 = ::std::__detail::operator==(&local_678,&local_690);
              if (bVar1) {
                BoundUnnestNode::BoundUnnestNode((BoundUnnestNode *)0xdab94c);
                local_6b0 = Binder::GenerateTableIndex(in_stack_fffffffffffff500);
                unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
                unique_ptr<duckdb::BoundUnnestExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                          ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)in_stack_fffffffffffff500,
                           (unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>_>
                            *)in_stack_fffffffffffff4f8);
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             *)in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
                unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                ~unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)0xdab9c8);
                local_680 = local_6b0;
                local_688 = 0;
                in_stack_fffffffffffff588 =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (in_RSI[0xe] + 0x2d0);
                ::std::make_pair<unsigned_long&,duckdb::BoundUnnestNode>
                          ((unsigned_long *)in_stack_fffffffffffff508,
                           (BoundUnnestNode *)in_stack_fffffffffffff500);
                _Var13 = ::std::
                         unordered_map<unsigned_long,duckdb::BoundUnnestNode,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::BoundUnnestNode>>>
                         ::insert<std::pair<unsigned_long,duckdb::BoundUnnestNode>>
                                   ((unordered_map<unsigned_long,_duckdb::BoundUnnestNode,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>_>_>
                                     *)in_stack_fffffffffffff510,
                                    (pair<unsigned_long,_duckdb::BoundUnnestNode> *)
                                    in_stack_fffffffffffff508);
                in_stack_fffffffffffff580._M_cur =
                     (__node_type *)
                     _Var13.first.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false>
                     ._M_cur;
                in_stack_fffffffffffff57f = _Var13.second;
                local_6f8._8_8_ = in_stack_fffffffffffff580._M_cur;
                local_6e8 = in_stack_fffffffffffff57f;
                ::std::pair<unsigned_long,_duckdb::BoundUnnestNode>::~pair
                          ((pair<unsigned_long,_duckdb::BoundUnnestNode> *)0xdaba6e);
                BoundUnnestNode::~BoundUnnestNode((BoundUnnestNode *)0xdaba7b);
              }
              else {
                ppVar12 = ::std::__detail::
                          _Node_iterator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false,_false>
                          ::operator->((_Node_iterator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false,_false>
                                        *)0xdabb30);
                local_680 = (ppVar12->second).index;
                ppVar12 = ::std::__detail::
                          _Node_iterator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false,_false>
                          ::operator->((_Node_iterator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false,_false>
                                        *)0xdabb46);
                local_688 = ::std::
                            vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                            ::size((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                    *)&(ppVar12->second).expressions);
                ::std::__detail::
                _Node_iterator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false,_false>
                ::operator->((_Node_iterator<std::pair<const_unsigned_long,_duckdb::BoundUnnestNode>,_false,_false>
                              *)0xdabb64);
                in_stack_fffffffffffff570 = (BinderException *)local_6f8;
                unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
                unique_ptr<duckdb::BoundUnnestExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                          ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)in_stack_fffffffffffff500,
                           (unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>_>
                            *)in_stack_fffffffffffff4f8);
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                             *)in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
                unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                ~unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)0xdabba5);
              }
              ColumnBinding::ColumnBinding(local_718,local_680,local_688);
              make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string,duckdb::LogicalType&,duckdb::ColumnBinding,unsigned_long&>
                        (in_stack_fffffffffffff588,(LogicalType *)in_stack_fffffffffffff580._M_cur,
                         (ColumnBinding *)
                         CONCAT17(in_stack_fffffffffffff57f,in_stack_fffffffffffff578),
                         (unsigned_long *)in_stack_fffffffffffff570);
              unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
              unique_ptr<duckdb::BoundColumnRefExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                        ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)in_stack_fffffffffffff500,
                         (unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>_>
                          *)in_stack_fffffffffffff4f8);
              unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator=((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffff500,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffff4f8);
              unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              ~unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)0xdabc52);
              unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
              ::~unique_ptr((unique_ptr<duckdb::BoundColumnRefExpression,_std::default_delete<duckdb::BoundColumnRefExpression>,_true>
                             *)0xdabc5f);
              ::std::__cxx11::string::~string(local_668);
              unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
              ::~unique_ptr((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                             *)0xdabc79);
            }
            if (local_5c8 != 0) {
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                        *)0xdabcd2);
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                           *)in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8);
              for (local_738 = 0; local_738 < local_5c8; local_738 = local_738 + 1) {
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)0xdabd15);
                local_751 = 0;
                local_760 = local_730;
                local_768._M_current =
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)::std::
                        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 *)in_stack_fffffffffffff4f8);
                local_770 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)::std::
                               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                               ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                      *)in_stack_fffffffffffff4f8);
                while (bVar1 = __gnu_cxx::operator!=
                                         ((__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                                           *)in_stack_fffffffffffff500,
                                          (__normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                                           *)in_stack_fffffffffffff4f8), bVar1) {
                  local_778 = __gnu_cxx::
                              __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                              ::operator*(&local_768);
                  pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                         *)in_stack_fffffffffffff500);
                  in_stack_fffffffffffff54f = LogicalType::id(&pEVar8->return_type);
                  if (in_stack_fffffffffffff54f == STRUCT) {
                    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)in_stack_fffffffffffff500);
                    local_780 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                 *)StructType::GetChildTypes_abi_cxx11_
                                             ((LogicalType *)in_stack_fffffffffffff500);
                    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)in_stack_fffffffffffff500);
                    bVar1 = StructType::IsUnnamed((LogicalType *)in_stack_fffffffffffff4f8);
                    if (bVar1) {
                      local_788 = 0;
                      while (uVar9 = local_788,
                            sVar6 = ::std::
                                    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ::size(local_780), uVar9 < sVar6) {
                        in_stack_fffffffffffff510 = (BindResult *)in_RSI[8];
                        pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                 ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                               *)in_stack_fffffffffffff500);
                        (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x11])(local_798);
                        CreateBoundStructExtractIndex
                                  (in_stack_fffffffffffff738,in_stack_fffffffffffff730,
                                   CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728));
                        ::std::
                        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     *)in_stack_fffffffffffff500,
                                    (value_type *)in_stack_fffffffffffff4f8);
                        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::~unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                       *)0xdabeeb);
                        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::~unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                       *)0xdabef8);
                        local_788 = local_788 + 1;
                      }
                    }
                    else {
                      local_7a0 = local_780;
                      local_7a8._M_current =
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                            *)::std::
                              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                              ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                       *)in_stack_fffffffffffff4f8);
                      local_7b0 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                                   *)::std::
                                     vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                            *)in_stack_fffffffffffff4f8);
                      while (bVar1 = __gnu_cxx::operator!=
                                               ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                                                 *)in_stack_fffffffffffff500,
                                                (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                                                 *)in_stack_fffffffffffff4f8), bVar1) {
                        local_7b8 = __gnu_cxx::
                                    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                                    ::operator*(&local_7a8);
                        in_stack_fffffffffffff500 = (Binder *)in_RSI[8];
                        in_stack_fffffffffffff508 =
                             (ErrorData *)
                             unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                           *)in_stack_fffffffffffff500);
                        (**(code **)(*(long *)in_stack_fffffffffffff508 + 0x88))(local_7c8);
                        ::std::__cxx11::string::string(local_7e8,(string *)local_7b8);
                        CreateBoundStructExtract
                                  ((ClientContext *)
                                   CONCAT17(in_stack_fffffffffffff72f,in_stack_fffffffffffff728),
                                   in_stack_fffffffffffff720,in_stack_fffffffffffff718);
                        ::std::
                        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                     *)in_stack_fffffffffffff500,
                                    (value_type *)in_stack_fffffffffffff4f8);
                        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::~unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                       *)0xdac0a0);
                        ::std::__cxx11::string::~string(local_7e8);
                        unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        ::~unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                       *)0xdac0ba);
                        __gnu_cxx::
                        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>_>
                        ::operator++(&local_7a8);
                      }
                    }
                    local_751 = 1;
                  }
                  else {
                    ::std::
                    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    ::push_back((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                                 *)in_stack_fffffffffffff500,(value_type *)in_stack_fffffffffffff4f8
                               );
                  }
                  __gnu_cxx::
                  __normal_iterator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                  ::operator++(&local_768);
                }
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::operator=((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)in_stack_fffffffffffff500,
                            (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                             *)in_stack_fffffffffffff4f8);
                if ((local_751 & 1) == 0) {
                  local_128 = 0xb;
                }
                else {
                  local_128 = 0;
                }
                vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                           *)0xdac1b5);
                if (local_128 != 0) break;
              }
              make_uniq<duckdb::BoundExpandedExpression,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>>
                        ((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548));
              unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
              unique_ptr<duckdb::BoundExpandedExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
                        ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)in_stack_fffffffffffff500,
                         (unique_ptr<duckdb::BoundExpandedExpression,_std::default_delete<duckdb::BoundExpandedExpression>_>
                          *)in_stack_fffffffffffff4f8);
              unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator=((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffff500,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)in_stack_fffffffffffff4f8);
              unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              ~unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)0xdac23c);
              unique_ptr<duckdb::BoundExpandedExpression,_std::default_delete<duckdb::BoundExpandedExpression>,_true>
              ::~unique_ptr((unique_ptr<duckdb::BoundExpandedExpression,_std::default_delete<duckdb::BoundExpandedExpression>,_true>
                             *)0xdac249);
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)0xdac256);
            }
            unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffff500,local_800);
            BindResult::BindResult
                      (in_stack_fffffffffffff510,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffff508);
            unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            ~unique_ptr((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)0xdac2a0);
            local_128 = 1;
            LogicalType::~LogicalType((LogicalType *)0xdac2b8);
          }
          else {
            unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffff500,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)in_stack_fffffffffffff4f8);
            paVar14 = &local_619;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_618,
                       "UNNEST() on a struct column can only be applied as the root element of a SELECT expression"
                       ,paVar14);
            BinderException::BinderException<>
                      (in_stack_fffffffffffff570,(ParsedExpression *)in_stack_fffffffffffff568,
                       in_stack_fffffffffffff560);
            BindResult::BindResult(in_stack_fffffffffffff510,(Exception *)in_stack_fffffffffffff508)
            ;
            BinderException::~BinderException((BinderException *)0xdab691);
            ::std::__cxx11::string::~string(local_618);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_619);
            local_128 = 1;
          }
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
                    ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)0xdac2f7);
          goto LAB_00dac308;
        }
      }
      local_17a = 1;
      uVar5 = __cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_178,
                 "\"DISTINCT\", \"FILTER\", and \"ORDER BY\" are not applicable to \"UNNEST\"",
                 &local_179);
      InvalidInputException::InvalidInputException
                ((InvalidInputException *)in_stack_fffffffffffff500,
                 (string *)in_stack_fffffffffffff4f8);
      local_17a = 0;
      __cxa_throw(uVar5,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    (**(code **)(*in_RSI + 0x70))(local_158);
    BinderException::BinderException<>
              (in_stack_fffffffffffff570,(ParsedExpression *)in_stack_fffffffffffff568,
               in_stack_fffffffffffff560);
    BindResult::BindResult(in_stack_fffffffffffff510,(Exception *)in_stack_fffffffffffff508);
    BinderException::~BinderException((BinderException *)0xdaa18c);
    ::std::__cxx11::string::~string(local_158);
    local_128 = 1;
  }
LAB_00dac308:
  ErrorData::~ErrorData((ErrorData *)in_stack_fffffffffffff500);
  return in_RDI;
}

Assistant:

BindResult SelectBinder::BindUnnest(FunctionExpression &function, idx_t depth, bool root_expression) {
	// bind the children of the function expression
	if (depth > 0) {
		return BindResult(BinderException(function, "UNNEST() for correlated expressions is not supported yet"));
	}

	ErrorData error;
	if (function.children.empty()) {
		return BindResult(BinderException(function, "UNNEST() requires a single argument"));
	}
	if (inside_window) {
		return BindResult(BinderException(function, UnsupportedUnnestMessage()));
	}

	if (function.distinct || function.filter || !function.order_bys->orders.empty()) {
		throw InvalidInputException("\"DISTINCT\", \"FILTER\", and \"ORDER BY\" are not "
		                            "applicable to \"UNNEST\"");
	}

	idx_t max_depth = 1;
	if (function.children.size() != 1) {
		bool has_parameter = false;
		bool supported_argument = false;
		for (idx_t i = 1; i < function.children.size(); i++) {
			if (has_parameter) {
				return BindResult(BinderException(function, "UNNEST() only supports a single additional argument"));
			}
			if (function.children[i]->HasParameter()) {
				throw ParameterNotAllowedException("Parameter not allowed in unnest parameter");
			}
			if (!function.children[i]->IsScalar()) {
				break;
			}
			auto alias = StringUtil::Lower(function.children[i]->GetAlias());
			BindChild(function.children[i], depth, error);
			if (error.HasError()) {
				return BindResult(std::move(error));
			}
			auto &const_child = BoundExpression::GetExpression(*function.children[i]);
			auto value = ExpressionExecutor::EvaluateScalar(context, *const_child, true);
			if (alias == "recursive") {
				auto recursive = value.GetValue<bool>();
				if (recursive) {
					max_depth = NumericLimits<idx_t>::Maximum();
				}
			} else if (alias == "max_depth") {
				max_depth = value.GetValue<uint32_t>();
				if (max_depth == 0) {
					throw BinderException("UNNEST cannot have a max depth of 0");
				}
			} else if (!alias.empty()) {
				throw BinderException("Unsupported parameter \"%s\" for unnest", alias);
			} else {
				break;
			}
			has_parameter = true;
			supported_argument = true;
		}
		if (!supported_argument) {
			return BindResult(BinderException(function, "UNNEST - unsupported extra argument, unnest only supports "
			                                            "recursive := [true/false] or max_depth := #"));
		}
	}
	unnest_level++;
	BindChild(function.children[0], depth, error);
	if (error.HasError()) {
		// failed to bind
		// try to bind correlated columns manually
		auto result = BindCorrelatedColumns(function.children[0], error);
		if (result.HasError()) {
			return BindResult(result.error);
		}
		auto &bound_expr = BoundExpression::GetExpression(*function.children[0]);
		ExtractCorrelatedExpressions(binder, *bound_expr);
	}
	auto &child = BoundExpression::GetExpression(*function.children[0]);
	auto &child_type = child->return_type;
	unnest_level--;

	if (unnest_level > 0) {
		throw BinderException(
		    function,
		    "Nested UNNEST calls are not supported - use UNNEST(x, recursive := true) to unnest multiple levels");
	}

	switch (child_type.id()) {
	case LogicalTypeId::UNKNOWN:
		throw ParameterNotResolvedException();
	case LogicalTypeId::LIST:
	case LogicalTypeId::STRUCT:
	case LogicalTypeId::SQLNULL:
		break;
	default:
		return BindResult(BinderException(function, "UNNEST() can only be applied to lists, structs and NULL, not %s",
		                                  child_type.ToString()));
	}

	idx_t list_unnests;
	idx_t struct_unnests = 0;

	auto unnest_expr = std::move(child);
	if (child_type.id() == LogicalTypeId::SQLNULL) {
		list_unnests = 1;
	} else {
		// perform all LIST unnests
		auto type = child_type;
		list_unnests = 0;
		while (type.id() == LogicalTypeId::LIST) {
			type = ListType::GetChildType(type);
			list_unnests++;
			if (list_unnests >= max_depth) {
				break;
			}
		}
		// unnest structs
		if (type.id() == LogicalTypeId::STRUCT) {
			struct_unnests = max_depth - list_unnests;
		}
	}
	if (struct_unnests > 0 && !root_expression) {
		child = std::move(unnest_expr);
		return BindResult(BinderException(
		    function, "UNNEST() on a struct column can only be applied as the root element of a SELECT expression"));
	}
	// perform all LIST unnests
	auto return_type = child_type;
	for (idx_t current_depth = 0; current_depth < list_unnests; current_depth++) {
		if (return_type.id() == LogicalTypeId::LIST) {
			return_type = ListType::GetChildType(return_type);
		}
		auto result = make_uniq<BoundUnnestExpression>(return_type);
		result->child = std::move(unnest_expr);
		auto alias = function.GetAlias().empty() ? result->ToString() : function.GetAlias();

		auto current_level = unnest_level + list_unnests - current_depth - 1;
		auto entry = node.unnests.find(current_level);
		idx_t unnest_table_index;
		idx_t unnest_column_index;
		if (entry == node.unnests.end()) {
			BoundUnnestNode unnest_node;
			unnest_node.index = binder.GenerateTableIndex();
			unnest_node.expressions.push_back(std::move(result));
			unnest_table_index = unnest_node.index;
			unnest_column_index = 0;
			node.unnests.insert(make_pair(current_level, std::move(unnest_node)));
		} else {
			unnest_table_index = entry->second.index;
			unnest_column_index = entry->second.expressions.size();
			entry->second.expressions.push_back(std::move(result));
		}
		// now create a column reference referring to the unnest
		unnest_expr = make_uniq<BoundColumnRefExpression>(
		    std::move(alias), return_type, ColumnBinding(unnest_table_index, unnest_column_index), depth);
	}
	// now perform struct unnests, if any
	if (struct_unnests > 0) {
		vector<unique_ptr<Expression>> struct_expressions;
		struct_expressions.push_back(std::move(unnest_expr));

		for (idx_t i = 0; i < struct_unnests; i++) {
			vector<unique_ptr<Expression>> new_expressions;
			// check if there are any structs left
			bool has_structs = false;
			for (auto &expr : struct_expressions) {
				if (expr->return_type.id() == LogicalTypeId::STRUCT) {
					// struct! push a struct_extract
					auto &child_types = StructType::GetChildTypes(expr->return_type);
					if (StructType::IsUnnamed(expr->return_type)) {
						for (idx_t child_index = 0; child_index < child_types.size(); child_index++) {
							new_expressions.push_back(
							    CreateBoundStructExtractIndex(context, expr->Copy(), child_index + 1));
						}
					} else {
						for (auto &entry : child_types) {
							new_expressions.push_back(CreateBoundStructExtract(context, expr->Copy(), entry.first));
						}
					}
					has_structs = true;
				} else {
					// not a struct - push as-is
					new_expressions.push_back(std::move(expr));
				}
			}
			struct_expressions = std::move(new_expressions);
			if (!has_structs) {
				break;
			}
		}
		unnest_expr = make_uniq<BoundExpandedExpression>(std::move(struct_expressions));
	}
	return BindResult(std::move(unnest_expr));
}